

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
* __thiscall
deqp::gls::BuiltinPrecisionTests::
generateInputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
          (Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
           *__return_storage_ptr__,BuiltinPrecisionTests *this,
          Samplings<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *samplings,FloatFormat *floatFormat,Precision intPrecision,size_t numSamples,Random *rnd)

{
  iterator iVar1;
  BuiltinPrecisionTests *pBVar2;
  Samplings<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pSVar3;
  size_t sVar4;
  void *pvVar5;
  void *pvVar6;
  const_iterator cVar7;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  void *pvVar11;
  void *pvVar12;
  void *pvVar13;
  void *pvVar14;
  undefined4 in_register_00000084;
  vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
  *pvVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  bool bVar20;
  In2 in2;
  In3 in3;
  InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  tuple;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  fixedInputs;
  In1 in1;
  In0 in0;
  set<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>_>
  seenInputs;
  Void local_13a;
  Void local_139;
  vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
  *local_138;
  vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
  *local_130;
  vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
  *local_128;
  undefined1 local_120 [21];
  Void local_10b [3];
  void *local_108;
  void *pvStack_100;
  long local_f8;
  void *pvStack_f0;
  void *local_e8;
  long lStack_e0;
  void *local_d8;
  void *pvStack_d0;
  long local_c8;
  void *pvStack_c0;
  void *local_b8;
  long lStack_b0;
  long local_a0;
  value_type local_98;
  value_type local_8c;
  BuiltinPrecisionTests *local_80;
  Samplings<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_78;
  size_t local_70;
  ulong local_68;
  _Rb_tree<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_std::_Identity<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>_>
  local_60;
  
  local_a0 = CONCAT44(in_register_00000084,intPrecision);
  (__return_storage_ptr__->in3).
  super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in3).
  super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in2).
  super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in3).
  super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in2).
  super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in2).
  super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in1).
  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in1).
  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in0).
  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in1).
  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in0).
  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in0).
  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8 = (void *)0x0;
  lStack_b0 = 0;
  local_c8 = 0;
  pvStack_c0 = (void *)0x0;
  local_d8 = (void *)0x0;
  pvStack_d0 = (void *)0x0;
  local_e8 = (void *)0x0;
  lStack_e0 = 0;
  local_f8 = 0;
  pvStack_f0 = (void *)0x0;
  local_108 = (void *)0x0;
  pvStack_100 = (void *)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  (**(code **)**(undefined8 **)this)(*(undefined8 **)this,samplings);
  (**(code **)**(undefined8 **)(this + 8))(*(undefined8 **)(this + 8),samplings,&pvStack_f0);
  (**(code **)**(undefined8 **)(this + 0x10))(*(undefined8 **)(this + 0x10),samplings,&local_d8);
  (**(code **)**(undefined8 **)(this + 0x18))(*(undefined8 **)(this + 0x18),samplings,&pvStack_c0);
  local_80 = this;
  local_78 = samplings;
  local_70 = numSamples;
  if (pvStack_100 != local_108) {
    local_128 = (vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
                 *)&__return_storage_ptr__->in2;
    local_130 = (vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
                 *)&__return_storage_ptr__->in3;
    lVar19 = 0;
    uVar16 = 0;
    pvVar6 = pvStack_f0;
    pvVar9 = local_e8;
    pvVar5 = local_108;
    pvVar8 = pvStack_100;
    pvVar14 = local_e8;
    do {
      bVar20 = pvVar14 != pvVar6;
      pvVar14 = pvVar6;
      if (bVar20) {
        uVar18 = 0;
        pvVar11 = local_d8;
        pvVar12 = pvStack_d0;
        pvVar13 = pvStack_d0;
        local_68 = uVar16;
        do {
          bVar20 = pvVar13 != pvVar11;
          pvVar13 = pvVar11;
          if (bVar20) {
            pvVar15 = (vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
                       *)0x0;
            pvVar5 = pvStack_c0;
            pvVar8 = local_b8;
            do {
              bVar20 = pvVar8 != pvVar5;
              pvVar8 = pvVar5;
              if (bVar20) {
                uVar17 = 0;
                local_138 = pvVar15;
                do {
                  lVar10 = 0;
                  do {
                    *(undefined4 *)(local_120 + lVar10 * 4) =
                         *(undefined4 *)((long)local_108 + lVar10 * 4 + lVar19);
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 3);
                  local_120._16_4_ = *(float *)((long)pvStack_f0 + uVar18 * 8 + 4);
                  local_120._12_4_ = *(float *)((long)pvStack_f0 + uVar18 * 8);
                  std::
                  _Rb_tree<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>,deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>,std::_Identity<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>,deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>,std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>>
                  ::
                  _M_insert_unique<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>const&>
                            ((_Rb_tree<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>,deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>,std::_Identity<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>,deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>,std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>>
                              *)&local_60,
                             (InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                              *)local_120);
                  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                  push_back(&__return_storage_ptr__->in0,(value_type *)local_120);
                  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                  push_back(&__return_storage_ptr__->in1,(value_type *)(local_120 + 0xc));
                  iVar1._M_current =
                       (__return_storage_ptr__->in2).
                       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar1._M_current ==
                      (__return_storage_ptr__->in2).
                      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
                    ::_M_realloc_insert<deqp::gls::BuiltinPrecisionTests::Void_const&>
                              (local_128,iVar1,(Void *)(local_120 + 0x14));
                  }
                  else {
                    (__return_storage_ptr__->in2).
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
                  }
                  iVar1._M_current =
                       (__return_storage_ptr__->in3).
                       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar1._M_current ==
                      (__return_storage_ptr__->in3).
                      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
                    ::_M_realloc_insert<deqp::gls::BuiltinPrecisionTests::Void_const&>
                              (local_130,iVar1,local_10b);
                  }
                  else {
                    (__return_storage_ptr__->in3).
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
                  }
                  uVar17 = uVar17 + 1;
                  pvVar5 = pvStack_c0;
                  pvVar8 = local_b8;
                  pvVar11 = local_d8;
                  pvVar12 = pvStack_d0;
                  pvVar15 = local_138;
                  uVar16 = local_68;
                } while (uVar17 < (ulong)((long)local_b8 - (long)pvStack_c0));
              }
              pvVar15 = pvVar15 + 1;
              pvVar6 = pvStack_f0;
              pvVar9 = local_e8;
              pvVar13 = pvVar12;
            } while (pvVar15 < (vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
                                *)((long)pvVar12 - (long)pvVar11));
          }
          uVar18 = uVar18 + 1;
          pvVar5 = local_108;
          pvVar8 = pvStack_100;
          pvVar14 = pvVar9;
        } while (uVar18 < (ulong)((long)pvVar9 - (long)pvVar6 >> 3));
      }
      uVar16 = uVar16 + 1;
      lVar19 = lVar19 + 0xc;
    } while (uVar16 < (ulong)(((long)pvVar8 - (long)pvVar5 >> 2) * -0x5555555555555555));
  }
  sVar4 = local_70;
  pSVar3 = local_78;
  pBVar2 = local_80;
  if (local_a0 != 0) {
    local_128 = (vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
                 *)&__return_storage_ptr__->in1;
    local_130 = (vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
                 *)&__return_storage_ptr__->in2;
    local_138 = (vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
                 *)&__return_storage_ptr__->in3;
    do {
      uVar16 = (ulong)floatFormat & 0xffffffff;
      (**(code **)(**(long **)pBVar2 + 8))(&local_8c,*(long **)pBVar2,pSVar3,uVar16,sVar4);
      (**(code **)(**(long **)(pBVar2 + 8) + 8))
                (&local_98,*(long **)(pBVar2 + 8),pSVar3,uVar16,sVar4);
      (**(code **)(**(long **)(pBVar2 + 0x10) + 8))(*(long **)(pBVar2 + 0x10),pSVar3,uVar16,sVar4);
      (**(code **)(**(long **)(pBVar2 + 0x18) + 8))(*(long **)(pBVar2 + 0x18),pSVar3,uVar16,sVar4);
      local_120._8_4_ = local_8c.m_data[2];
      local_120._0_4_ = local_8c.m_data[0];
      local_120._4_4_ = local_8c.m_data[1];
      local_120._12_4_ = local_98.m_data[0];
      local_120._16_4_ = local_98.m_data[1];
      cVar7 = std::
              _Rb_tree<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_std::_Identity<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>_>
              ::find(&local_60,(key_type *)local_120);
      if ((_Rb_tree_header *)cVar7._M_node == &local_60._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>,deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>,std::_Identity<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>,deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>,std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>>
        ::
        _M_insert_unique<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>const&>
                  ((_Rb_tree<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>,deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>,std::_Identity<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>,deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>,std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,3>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>>>
                    *)&local_60,(key_type *)local_120);
        std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                  (&__return_storage_ptr__->in0,&local_8c);
        std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
                  ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                   local_128,&local_98);
        iVar1._M_current =
             (__return_storage_ptr__->in2).
             super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->in2).
            super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
          ::_M_realloc_insert<deqp::gls::BuiltinPrecisionTests::Void_const&>
                    (local_130,iVar1,&local_139);
        }
        else {
          (__return_storage_ptr__->in2).
          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        iVar1._M_current =
             (__return_storage_ptr__->in3).
             super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->in3).
            super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<deqp::gls::BuiltinPrecisionTests::Void,std::allocator<deqp::gls::BuiltinPrecisionTests::Void>>
          ::_M_realloc_insert<deqp::gls::BuiltinPrecisionTests::Void_const&>
                    (local_138,iVar1,&local_13a);
        }
        else {
          (__return_storage_ptr__->in3).
          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
      }
      local_a0 = local_a0 + -1;
    } while (local_a0 != 0);
  }
  std::
  _Rb_tree<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>,_std::_Identity<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_deqp::gls::BuiltinPrecisionTests::InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>,_std::allocator<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>_>
  ::~_Rb_tree(&local_60);
  if (pvStack_c0 != (void *)0x0) {
    operator_delete(pvStack_c0,lStack_b0 - (long)pvStack_c0);
  }
  if (local_d8 != (void *)0x0) {
    operator_delete(local_d8,local_c8 - (long)local_d8);
  }
  if (pvStack_f0 != (void *)0x0) {
    operator_delete(pvStack_f0,lStack_e0 - (long)pvStack_f0);
  }
  if (local_108 != (void *)0x0) {
    operator_delete(local_108,local_f8 - (long)local_108);
  }
  return __return_storage_ptr__;
}

Assistant:

Inputs<In> generateInputs (const Samplings<In>&	samplings,
						   const FloatFormat&	floatFormat,
						   Precision			intPrecision,
						   size_t				numSamples,
						   Random&				rnd)
{
	Inputs<In>									ret;
	Inputs<In>									fixedInputs;
	set<InTuple<In>, InputLess<InTuple<In> > >	seenInputs;

	samplings.in0.genFixeds(floatFormat, fixedInputs.in0);
	samplings.in1.genFixeds(floatFormat, fixedInputs.in1);
	samplings.in2.genFixeds(floatFormat, fixedInputs.in2);
	samplings.in3.genFixeds(floatFormat, fixedInputs.in3);

	for (size_t ndx0 = 0; ndx0 < fixedInputs.in0.size(); ++ndx0)
	{
		for (size_t ndx1 = 0; ndx1 < fixedInputs.in1.size(); ++ndx1)
		{
			for (size_t ndx2 = 0; ndx2 < fixedInputs.in2.size(); ++ndx2)
			{
				for (size_t ndx3 = 0; ndx3 < fixedInputs.in3.size(); ++ndx3)
				{
					const InTuple<In>	tuple	(fixedInputs.in0[ndx0],
												 fixedInputs.in1[ndx1],
												 fixedInputs.in2[ndx2],
												 fixedInputs.in3[ndx3]);

					seenInputs.insert(tuple);
					ret.in0.push_back(tuple.a);
					ret.in1.push_back(tuple.b);
					ret.in2.push_back(tuple.c);
					ret.in3.push_back(tuple.d);
				}
			}
		}
	}

	for (size_t ndx = 0; ndx < numSamples; ++ndx)
	{
		const typename In::In0	in0		= samplings.in0.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In1	in1		= samplings.in1.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In2	in2		= samplings.in2.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In3	in3		= samplings.in3.genRandom(floatFormat, intPrecision, rnd);
		const InTuple<In>		tuple	(in0, in1, in2, in3);

		if (de::contains(seenInputs, tuple))
			continue;

		seenInputs.insert(tuple);
		ret.in0.push_back(in0);
		ret.in1.push_back(in1);
		ret.in2.push_back(in2);
		ret.in3.push_back(in3);
	}

	return ret;
}